

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_xz.c
# Opt level: O3

int xz_lzma_bidder_init(archive_read_filter *self)

{
  int iVar1;
  lzma_ret ret;
  lzma_stream *strm;
  uint8_t *__ptr;
  
  strm = (lzma_stream *)calloc(0xb8,1);
  __ptr = (uint8_t *)malloc(0x10000);
  if (strm == (lzma_stream *)0x0 || __ptr == (uint8_t *)0x0) {
    archive_set_error(&self->archive->archive,0xc,"Can\'t allocate data for xz decompression");
    free(__ptr);
    free(strm);
  }
  else {
    self->data = strm;
    strm[1].avail_in = 0x10000;
    strm[1].next_in = __ptr;
    self->vtable = &xz_lzma_reader_vtable;
    strm->next_out = __ptr;
    strm->avail_out = 0x10000;
    iVar1 = self->code;
    if (iVar1 == 9) {
      return 0;
    }
    *(undefined1 *)((long)&strm[1].next_out + 1) = 1;
    if (iVar1 == 6) {
      ret = lzma_stream_decoder(strm,0xffffffffffffffff,8);
    }
    else {
      ret = lzma_alone_decoder(strm,0xffffffffffffffff);
    }
    if (ret == LZMA_OK) {
      return 0;
    }
    set_error(self,ret);
    free(strm[1].next_in);
    free(strm);
    self->data = (void *)0x0;
  }
  return -0x1e;
}

Assistant:

static int
xz_lzma_bidder_init(struct archive_read_filter *self)
{
	static const size_t out_block_size = 64 * 1024;
	void *out_block;
	struct private_data *state;
	int ret;

	state = (struct private_data *)calloc(sizeof(*state), 1);
	out_block = (unsigned char *)malloc(out_block_size);
	if (state == NULL || out_block == NULL) {
		archive_set_error(&self->archive->archive, ENOMEM,
		    "Can't allocate data for xz decompression");
		free(out_block);
		free(state);
		return (ARCHIVE_FATAL);
	}

	self->data = state;
	state->out_block_size = out_block_size;
	state->out_block = out_block;
	self->vtable = &xz_lzma_reader_vtable;

	state->stream.avail_in = 0;

	state->stream.next_out = state->out_block;
	state->stream.avail_out = state->out_block_size;

	state->crc32 = 0;
	if (self->code == ARCHIVE_FILTER_LZIP) {
		/*
		 * We have to read a lzip header and use it to initialize
		 * compression library, thus we cannot initialize the
		 * library for lzip here.
		 */
		state->in_stream = 0;
		return (ARCHIVE_OK);
	} else
		state->in_stream = 1;

	/* Initialize compression library. */
	if (self->code == ARCHIVE_FILTER_XZ)
		ret = lzma_stream_decoder(&(state->stream),
		    LZMA_MEMLIMIT,/* memlimit */
		    LZMA_CONCATENATED);
	else
		ret = lzma_alone_decoder(&(state->stream),
		    LZMA_MEMLIMIT);/* memlimit */

	if (ret == LZMA_OK)
		return (ARCHIVE_OK);

	/* Library setup failed: Choose an error message and clean up. */
	set_error(self, ret);

	free(state->out_block);
	free(state);
	self->data = NULL;
	return (ARCHIVE_FATAL);
}